

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  Extension *pEVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  CppType CVar5;
  RepeatedPtrField<google::protobuf::MessageLite> *this_00;
  Descriptor *pDVar6;
  LogMessage *pLVar7;
  undefined4 extraout_var;
  LogFinisher local_142;
  byte local_141;
  LogMessage local_140;
  MessageLite *local_108;
  MessageLite *prototype;
  MessageLite *result;
  LogMessage local_f0;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  Extension *local_28;
  Extension *extension;
  MessageFactory *factory_local;
  FieldDescriptor *descriptor_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)factory;
  factory_local = (MessageFactory *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  iVar3 = FieldDescriptor::number(descriptor);
  bVar2 = MaybeNewExtension(this,iVar3,(FieldDescriptor *)factory_local,&local_28);
  if (bVar2) {
    TVar4 = FieldDescriptor::type((FieldDescriptor *)factory_local);
    local_28->type = (FieldType)TVar4;
    CVar5 = cpp_type(local_28->type);
    local_61 = 0;
    if (CVar5 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xbe);
      local_61 = 1;
      pLVar7 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(local_75,pLVar7);
    }
    if ((local_61 & 1) != 0) {
      LogMessage::~LogMessage(&local_60);
    }
    local_28->is_repeated = true;
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
    RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField(this_00);
    (local_28->field_0).repeated_message_value = this_00;
  }
  else {
    iVar3 = 1;
    if ((local_28->is_repeated & 1U) != 0) {
      iVar3 = 3;
    }
    local_b1 = 0;
    if (iVar3 != 3) {
      LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xc3);
      local_b1 = 1;
      pLVar7 = LogMessage::operator<<
                         (&local_b0,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_REPEATED): "
                         );
      LogFinisher::operator=(&local_b2,pLVar7);
    }
    if ((local_b1 & 1) != 0) {
      LogMessage::~LogMessage(&local_b0);
    }
    CVar5 = cpp_type(local_28->type);
    result._7_1_ = 0;
    if (CVar5 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_f0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xc3);
      result._7_1_ = 1;
      pLVar7 = LogMessage::operator<<
                         (&local_f0,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)((long)&result + 6),pLVar7);
    }
    if ((result._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_f0);
    }
  }
  prototype = RepeatedPtrFieldBase::
              AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                        ((RepeatedPtrFieldBase *)(local_28->field_0).string_value);
  if (prototype == (Type *)0x0) {
    iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                      ((local_28->field_0).repeated_message_value);
    pEVar1 = extension;
    if (iVar3 == 0) {
      pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)factory_local);
      local_108 = (MessageLite *)
                  (*(code *)(((pEVar1->field_0).string_value)->field_2)._M_allocated_capacity)
                            (pEVar1,pDVar6);
      local_141 = 0;
      if (local_108 == (MessageLite *)0x0) {
        LogMessage::LogMessage
                  (&local_140,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                   ,0xce);
        local_141 = 1;
        pLVar7 = LogMessage::operator<<(&local_140,"CHECK failed: prototype != NULL: ");
        LogFinisher::operator=(&local_142,pLVar7);
      }
      if ((local_141 & 1) != 0) {
        LogMessage::~LogMessage(&local_140);
      }
    }
    else {
      local_108 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((local_28->field_0).repeated_message_value,0);
    }
    iVar3 = (*local_108->_vptr_MessageLite[3])();
    prototype = (MessageLite *)CONCAT44(extraout_var,iVar3);
    RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
              ((local_28->field_0).repeated_message_value,prototype);
  }
  return prototype;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
      new RepeatedPtrField<MessageLite>();
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = extension->repeated_message_value
      ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    const MessageLite* prototype;
    if (extension->repeated_message_value->size() == 0) {
      prototype = factory->GetPrototype(descriptor->message_type());
      GOOGLE_CHECK(prototype != NULL);
    } else {
      prototype = &extension->repeated_message_value->Get(0);
    }
    result = prototype->New();
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}